

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Paged_Device.cxx
# Opt level: O2

void __thiscall
Fl_Paged_Device::print_window_part
          (Fl_Paged_Device *this,Fl_Window *win,int x,int y,int w,int h,int delta_x,int delta_y)

{
  Fl_Surface_Device *pFVar1;
  Fl_Display_Device *pFVar2;
  Fl_Window *pFVar3;
  uchar *puVar4;
  
  pFVar1 = Fl_Surface_Device::surface();
  pFVar2 = Fl_Display_Device::display_device();
  (*(pFVar2->super_Fl_Surface_Device).super_Fl_Device._vptr_Fl_Device[3])(pFVar2);
  pFVar3 = Fl::first_window();
  (*(win->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[5])(win);
  fl_gc = (GC)0x0;
  Fl::check();
  Fl_Window::make_current(win);
  puVar4 = fl_read_image((uchar *)0x0,x,y,w,h,0);
  if (pFVar3 != win) {
    (*(pFVar3->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[5])(pFVar3);
  }
  (*(pFVar1->super_Fl_Device)._vptr_Fl_Device[3])(pFVar1);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2f])
            (fl_graphics_driver,puVar4,(ulong)(uint)delta_x,(ulong)(uint)delta_y,w,(ulong)(uint)h,3,
             0);
  if (puVar4 != (uchar *)0x0) {
    operator_delete__(puVar4);
    return;
  }
  return;
}

Assistant:

void Fl_Paged_Device::print_window_part(Fl_Window *win, int x, int y, int w, int h, int delta_x, int delta_y)
{
  Fl_Surface_Device *current = Fl_Surface_Device::surface();
  Fl_Display_Device::display_device()->set_current();
  Fl_Window *save_front = Fl::first_window();
  win->show();
  fl_gc = NULL;
  Fl::check();
  win->make_current();
  uchar *image_data;
  image_data = fl_read_image(NULL, x, y, w, h);
#ifdef __APPLE__
  Fl_X::q_release_context(); // matches make_current() call above
#endif
  if (save_front != win) save_front->show();
  current->set_current();
  fl_draw_image(image_data, delta_x, delta_y, w, h, 3);
  delete[] image_data;
#ifdef WIN32
  fl_gc = GetDC(fl_xid(win));
  ReleaseDC(fl_xid(win), fl_gc);
#endif
}